

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

void __thiscall Array::Array(Array *this,string *name,attr *a)

{
  iterator *this_00;
  int iVar1;
  size_type sVar2;
  reference piVar3;
  long __n;
  int local_2c;
  
  std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)this);
  (this->newName)._M_dataplus._M_p = (pointer)&(this->newName).field_2;
  (this->newName)._M_string_length = 0;
  (this->newName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->newName);
  for (; a->kind == 1; a = ((a->field_1).array)->type) {
    std::deque<int,_std::allocator<int>_>::push_front(&this->directSize,&((a->field_1).basic)->type)
    ;
  }
  if (a->kind == 0) {
    local_2c = 4;
    std::deque<int,_std::allocator<int>_>::emplace_front<int>(&this->directSize,&local_2c);
    this_00 = &(this->directSize).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start;
    __n = 1;
    while( true ) {
      sVar2 = std::deque<int,_std::allocator<int>_>::size(&this->directSize);
      if ((int)sVar2 <= __n) break;
      piVar3 = std::_Deque_iterator<int,_int_&,_int_*>::operator[](this_00,__n + -1);
      iVar1 = *piVar3;
      piVar3 = std::_Deque_iterator<int,_int_&,_int_*>::operator[](this_00,__n);
      *piVar3 = iVar1 * *piVar3;
      __n = __n + 1;
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,"Structure not implemented!\n");
  exit(1);
}

Assistant:

Array(const string &name, attr *a) {
        newName = name;
        while (a->kind == ARRAY) {
            directSize.push_front(a->array->size);
            a = a->array->type;
        }
        if (a->kind == BASIC) directSize.push_front(4);
        else { /* TODO Struct */
            IMP_ME("Structure");
        }
        for (int i = 1; i < (int)directSize.size(); ++i)
            directSize[i] *= directSize[i - 1];
    }